

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O1

wchar_t format_small_keypad_key
                  (char *buf,Terminal *term,SmallKeypadKey key,_Bool shift,_Bool ctrl,_Bool alt,
                  _Bool *consumed_alt)

{
  char cVar1;
  wchar_t wVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  char *pcVar7;
  
  if (SKK_PGDN < key) {
    __assert_fail("false && \"bad small keypad key enum value\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                  ,0x1d46,
                  "int format_small_keypad_key(char *, Terminal *, SmallKeypadKey, _Bool, _Bool, _Bool, _Bool *)"
                 );
  }
  uVar5 = (ulong)*(uint *)(&DAT_00122f4c + (ulong)key * 4);
  wVar2 = term->funky_type;
  if (wVar2 == L'\x03') {
    uVar5 = (ulong)(uint)(int)""[uVar5];
  }
  iVar3 = (int)uVar5;
  iVar6 = (int)buf;
  if ((term->vt52_mode == true) && (iVar3 - 1U < 6)) {
    cVar1 = " HLMEIG"[uVar5];
    pcVar7 = "\x1b%c";
LAB_0010f98d:
    uVar5 = (ulong)(uint)(int)cVar1;
LAB_0010f990:
    iVar3 = sprintf(buf,pcVar7,uVar5);
  }
  else {
    if (wVar2 == L'\x05') {
      if (iVar3 == 3) {
        iVar3 = iVar6 + 1;
        *buf = '\x7f';
        goto LAB_0010f99c;
      }
      cVar1 = " HLMEIG"[(long)iVar3 + 7];
      pcVar7 = "\x1b[%c";
      goto LAB_0010f98d;
    }
    if (((iVar3 != 4) && (iVar3 != 1)) || (term->rxvt_homeend != true)) {
      if (term->vt52_mode == false) {
        uVar4 = 0;
        if (wVar2 == L'\x06') {
          if (alt && consumed_alt != (_Bool *)0x0) {
            *consumed_alt = true;
          }
          iVar3 = (uint)shift + (uint)ctrl * 4;
          uVar4 = iVar3 + 1 + (uint)alt * 2;
          if (iVar3 + (uint)alt * 2 == 0) {
            uVar4 = 0;
          }
        }
        if (uVar4 != 0) {
          iVar3 = sprintf(buf,"\x1b[%d;%d~",uVar5,(ulong)uVar4);
          goto LAB_0010f997;
        }
      }
      pcVar7 = "\x1b[%d~";
      goto LAB_0010f990;
    }
    pcVar7 = "\x1bOw";
    if (iVar3 == 1) {
      pcVar7 = "\x1b[H";
    }
    iVar3 = sprintf(buf,pcVar7);
  }
LAB_0010f997:
  iVar3 = iVar3 + iVar6;
LAB_0010f99c:
  return iVar3 - iVar6;
}

Assistant:

int format_small_keypad_key(char *buf, Terminal *term, SmallKeypadKey key,
                            bool shift, bool ctrl, bool alt,
                            bool *consumed_alt)
{
    char *p = buf;

    int code;
    switch (key) {
      case SKK_HOME: code = 1; break;
      case SKK_INSERT: code = 2; break;
      case SKK_DELETE: code = 3; break;
      case SKK_END: code = 4; break;
      case SKK_PGUP: code = 5; break;
      case SKK_PGDN: code = 6; break;
      default: unreachable("bad small keypad key enum value");
    }

    /* Reorder edit keys to physical order */
    if (term->funky_type == FUNKY_VT400 && code <= 6)
        code = "\0\2\1\4\5\3\6"[code];

    if (term->vt52_mode && code > 0 && code <= 6) {
        p += sprintf(p, "\x1B%c", " HLMEIG"[code]);
    } else if (term->funky_type == FUNKY_SCO) {
        static const char codes[] = "HL.FIG";
        if (code == 3) {
            *p++ = '\x7F';
        } else {
            p += sprintf(p, "\x1B[%c", codes[code-1]);
        }
    } else if ((code == 1 || code == 4) && term->rxvt_homeend) {
        p += sprintf(p, code == 1 ? "\x1B[H" : "\x1BOw");
    } else {
        if (term->vt52_mode) {
	    p += sprintf(p, "\x1B[%d~", code);
        } else {
            int bitmap = 0;
            if (term->funky_type == FUNKY_XTERM_216)
                bitmap = shift_bitmap(shift, ctrl, alt, consumed_alt);
            if (bitmap)
                p += sprintf(p, "\x1B[%d;%d~", code, bitmap);
            else
                p += sprintf(p, "\x1B[%d~", code);
        }
    }

    return p - buf;
}